

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O1

void perfetto::internal::TrackEventInternal::WriteTrackDescriptor<perfetto::Track>
               (Track *track,TraceWriterBase *trace_writer,TrackEventIncrementalState *incr_state,
               TrackEventTlsState *tls_state,TraceTimestamp *timestamp)

{
  TrackRegistry *this;
  TraceTimestamp timestamp_00;
  TraceWriterBase local_38;
  
  if (incr_state->was_cleared == true) {
    incr_state->was_cleared = false;
    ResetIncrementalState(trace_writer,incr_state,tls_state,timestamp);
  }
  this = TrackRegistry::instance_;
  timestamp_00.value._0_4_ = timestamp->clock_id;
  timestamp_00._0_8_ = tls_state;
  timestamp_00.value._4_4_ = 0;
  NewTracePacket(&local_38,(TrackEventIncrementalState *)trace_writer,
                 (TrackEventTlsState *)incr_state,timestamp_00,(uint32_t)timestamp->value);
  TrackRegistry::SerializeTrack<perfetto::Track>
            (this,track,(MessageHandle<perfetto::protos::pbzero::TracePacket> *)&local_38);
  protozero::MessageHandleBase::~MessageHandleBase((MessageHandleBase *)&local_38);
  return;
}

Assistant:

static void WriteTrackDescriptor(const TrackType& track,
                                   TraceWriterBase* trace_writer,
                                   TrackEventIncrementalState* incr_state,
                                   const TrackEventTlsState& tls_state,
                                   const TraceTimestamp& timestamp) {
    ResetIncrementalStateIfRequired(trace_writer, incr_state, tls_state,
                                    timestamp);
    TrackRegistry::Get()->SerializeTrack(
        track, NewTracePacket(trace_writer, incr_state, tls_state, timestamp));
  }